

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

ssize_t __thiscall vkt::Draw::Image::read(Image *this,int __fd,void *__buf,size_t __nbytes)

{
  deInt32 *pdVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  int in_R8D;
  int in_R9D;
  VkOffset3D offset;
  int in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  VkImageAspectFlagBits in_stack_00000028;
  VkImageType in_stack_00000030;
  void *in_stack_00000040;
  SharedPtr<vkt::Draw::Image> stagingResource;
  
  offset._0_8_ = __nbytes & 0xffffffff;
  offset.z = in_stack_00000008;
  copyToLinearImage((Image *)&stagingResource,(VkQueue)this,
                    (Allocator *)CONCAT44(in_register_00000034,__fd),(VkImageLayout)__buf,offset,
                    in_R8D,in_R9D,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                    in_stack_00000028,in_stack_00000030);
  readLinear(stagingResource.m_ptr,(VkOffset3D)ZEXT812(0),in_stack_00000008,in_stack_00000010,
             in_stack_00000018,0,0,in_stack_00000030,in_stack_00000040);
  if (stagingResource.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(stagingResource.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      stagingResource.m_ptr = (Image *)0x0;
      (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(stagingResource.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (stagingResource.m_state != (SharedPtrStateBase *)0x0)) {
      iVar2 = (*(stagingResource.m_state)->_vptr_SharedPtrStateBase[1])();
      stagingResource.m_state = (SharedPtrStateBase *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (ssize_t)stagingResource.m_state;
}

Assistant:

void Image::read (vk::VkQueue					queue,
				  vk::Allocator&				allocator,
				  vk::VkImageLayout				layout,
				  vk::VkOffset3D				offset,
				  int							width,
				  int							height,
				  int							depth,
				  unsigned int					mipLevel,
				  unsigned int					arrayElement,
				  vk::VkImageAspectFlagBits		aspect,
				  vk::VkImageType				type,
				  void *						data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Image> stagingResource = copyToLinearImage(queue, allocator, layout, offset, width,
															 height, depth, mipLevel, arrayElement, aspect, type);
	const vk::VkOffset3D zeroOffset = {0, 0, 0};
	stagingResource->readLinear(zeroOffset, width, height, depth, 0, 0, aspect, data);
}